

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_layout_space_end(nk_context *ctx)

{
  undefined8 *puVar1;
  nk_panel *pnVar2;
  nk_rect *__s;
  ulong __n;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x45c2,"void nk_layout_space_end(struct nk_context *)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x45c3,"void nk_layout_space_end(struct nk_context *)");
  }
  pnVar2 = ctx->current->layout;
  if (pnVar2 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x45c4,"void nk_layout_space_end(struct nk_context *)");
  }
  (pnVar2->row).item_width = 0.0;
  (pnVar2->row).item_height = 0.0;
  (pnVar2->row).item_offset = 0.0;
  __s = &(pnVar2->row).item;
  __n = (ulong)__s & 3;
  if (__n != 0) {
    memset(__s,0,4 - __n);
    puVar1 = (undefined8 *)((long)__s + (4 - __n));
    *puVar1 = 0;
    *(undefined4 *)(puVar1 + 1) = 0;
    memset((void *)((long)puVar1 + 0xc),0,__n);
    return;
  }
  __s->x = 0.0;
  __s->y = 0.0;
  (pnVar2->row).item.w = 0.0;
  (pnVar2->row).item.h = 0.0;
  return;
}

Assistant:

NK_API void
nk_layout_space_end(struct nk_context *ctx)
{
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    layout->row.item_width = 0;
    layout->row.item_height = 0;
    layout->row.item_offset = 0;
    nk_zero(&layout->row.item, sizeof(layout->row.item));
}